

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

String * __thiscall
glcts::LayoutBindingBaseCase::buildUniformName
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,String *var)

{
  ostringstream s;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(var->_M_dataplus)._M_p,var->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildUniformName(String& var)
	{
		std::ostringstream s;
		s << var;
		return s.str();
	}